

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcmain3.c
# Opt level: O2

LispPTR gcscanstack(void)

{
  byte bVar1;
  LispPTR LVar2;
  uint uVar3;
  ushort uVar4;
  uint *puVar5;
  uint *puVar6;
  LispPTR *pLVar7;
  uint *puVar8;
  uint *puVar9;
  char *__format;
  long lVar10;
  uint *puVar11;
  uint *puVar12;
  uint *puVar13;
  uint *puVar14;
  char debugStr [100];
  
  puVar5 = (uint *)((ulong)((uint)InterfacePage->endofstack * 2 + 0x20000) + (long)Lisp_world);
  puVar6 = NativeAligned4FromLAddr(InterfacePage->stackbase | 0x10000);
  if (((ulong)puVar6 & 3) != 0) {
    sprintf(debugStr,"Frame ptr (%p) not to word bound at start of gcscanstack.",puVar6);
    error(debugStr);
  }
LAB_0011f4fb:
  do {
    while( true ) {
      puVar8 = puVar6;
      uVar4 = *(ushort *)((long)puVar8 + 2) >> 0xd;
      if (uVar4 == 5) goto LAB_0011f604;
      if (uVar4 == 6) break;
      if (uVar4 != 7) {
        do {
          do {
            do {
              puVar6 = puVar8 + 1;
              uVar3 = *puVar8;
              puVar8 = puVar6;
            } while (*(short *)((ulong)(uVar3 >> 8 & 0xffffe) + (long)MDStypetbl ^ 2) < 0);
          } while (*GcDisabled_word == 0x4c);
          rec_htfind(uVar3 & 0xfffffff,2);
        } while( true );
      }
      if (puVar5 <= puVar8) {
        return 0;
      }
      puVar6 = (uint *)((long)puVar8 + (ulong)(ushort)*puVar8 * 2);
      if (((ulong)puVar6 & 3) != 0) {
        __format = "Frame ptr (%p) not to word bound in gcscanstack() STK_GUARD; old frame = %p.";
        goto LAB_0011f7f4;
      }
    }
    uVar3 = puVar8[1];
    if ((-1 < *(short *)((ulong)(uVar3 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2)) &&
       (*GcDisabled_word != 0x4c)) {
      rec_htfind(uVar3,2);
    }
    pLVar7 = NativeAligned4FromLAddr(uVar3);
    bVar1 = *(byte *)((long)pLVar7 + 0xd);
    for (lVar10 = 0; (uint)bVar1 != (uint)lVar10; lVar10 = lVar10 + 1) {
      LVar2 = puVar8[lVar10 + 5];
      if (((LVar2 < 0x10000000) &&
          (-1 < *(short *)((ulong)(LVar2 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2))) &&
         (*GcDisabled_word != 0x4c)) {
        rec_htfind(LVar2,2);
      }
    }
    puVar6 = (uint *)(Stackspace + *(ushort *)((long)puVar8 + 10));
    if ((*puVar8 & 0x2000000) == 0) {
LAB_0011f5f9:
      puVar11 = (uint *)0x0;
      puVar9 = puVar6;
    }
    else {
      uVar3 = puVar8[3];
      if ((uVar3 & 0xffff0000) != 0x10000) {
        if ((-1 < *(short *)((ulong)(MDStypetbl + (uVar3 >> 9)) ^ 2)) && (*GcDisabled_word != 0x4c))
        {
          rec_htfind(uVar3,2);
        }
        goto LAB_0011f5f9;
      }
      if ((-1 < *(short *)((long)MDStypetbl + (ulong)(pLVar7[2] >> 8 & 0xffffe) ^ 2)) &&
         (*GcDisabled_word != 0x4c)) {
        rec_htfind(pLVar7[2] & 0xfffffff,2);
      }
      puVar9 = (uint *)(Stackspace + (uVar3 & 0xffff));
      puVar11 = puVar9 + (ulong)*(ushort *)((long)puVar9 + 0xe) + 4;
    }
    puVar13 = puVar8 + (long)*(short *)((long)pLVar7 + 6) * 2 + 9;
    puVar14 = puVar13;
    if (((ulong)puVar13 & 3) != 0) {
      sprintf(debugStr,
              "Frame ptr (%p) not to word bound in gcscanstack() STK_FX case; old frame = %p.",
              puVar13,puVar8);
      error(debugStr);
    }
    while( true ) {
      for (; puVar12 = puVar11, puVar8 = puVar13, puVar14 < puVar9; puVar14 = puVar14 + 1) {
        LVar2 = *puVar8;
        if (((LVar2 < 0x10000000) &&
            (-1 < *(short *)((ulong)(LVar2 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2))) &&
           (*GcDisabled_word != 0x4c)) {
          rec_htfind(LVar2,2);
        }
        puVar13 = puVar8 + 1;
        puVar11 = puVar12;
      }
      if (puVar12 == (uint *)0x0) break;
      puVar13 = puVar12;
      puVar14 = puVar12;
      puVar11 = (uint *)0x0;
      puVar9 = puVar6;
      if (((ulong)puVar12 & 3) != 0) {
        sprintf(debugStr,
                "Frame ptr (%p) not to word bound in gcscanstack() scantemps; old frame = %p.",
                puVar12,puVar8);
        error(debugStr);
        puVar11 = (uint *)0x0;
      }
    }
  } while (((ulong)puVar6 & 3) == 0);
  __format = "Frame ptr (%p) not to word bound in gcscanstack(), end scantemps; old frame = %p.";
  goto LAB_0011f7f4;
LAB_0011f604:
  puVar6 = (uint *)((long)puVar8 + (ulong)(ushort)*puVar8 * 2);
  if (((ulong)puVar6 & 3) == 0) goto LAB_0011f4fb;
  __format = "Frame ptr (%p) not to word bound in gcscanstack() STK_FSB; old frame = %p.";
LAB_0011f7f4:
  sprintf(debugStr,__format,puVar6,puVar8);
  error(debugStr);
  goto LAB_0011f4fb;
}

Assistant:

LispPTR gcscanstack(void) {
  Bframe *basicframe;
  Bframe *obasicframe;
  LispPTR scanptr, scanend;
  UNSIGNED scanend68K;
  int ftyp;

  scanptr = VAG2(STK_HI, InterfacePage->stackbase);
  scanend = VAG2(STK_HI, InterfacePage->endofstack);
  scanend68K = (UNSIGNED)NativeAligned2FromLAddr(scanend);
  basicframe = (Bframe *)NativeAligned4FromLAddr(scanptr);

  if (0 != (3 & (UNSIGNED)basicframe)) {
    char debugStr[100];
    sprintf(debugStr,
            "Frame ptr (%p) not to word bound at start of gcscanstack.",
            (void *)basicframe);
    error(debugStr);
  }

  while (1) {
    /*This is endless loop until encountering tail of stack */

    ftyp = (int)basicframe->flags;
    switch (ftyp) {
      case STK_FX: {
        {
          struct frameex1 *frameex;
          struct fnhead *fnheader;
          frameex = (struct frameex1 *)basicframe;
          {
            LispPTR fn_head;
#ifdef BIGVM
            fn_head = (LispPTR)(frameex->fnheader);
#else
            fn_head = (LispPTR)VAG2(frameex->hi2fnheader, frameex->lofnheader);
#endif /* BIGVM */
            Stkref(fn_head);
            fnheader = (struct fnhead *)NativeAligned4FromLAddr(fn_head);
          }
          {
            int pcou;
            LispPTR *pvars;
            pvars = (LispPTR *)((DLword *)basicframe + FRAMESIZE);
            for (pcou = fnheader->nlocals; pcou-- != 0;) {
              LispPTR value;
              value = *pvars;
              if
                Boundp(BIND_BITS(value)) Stkref(value);
              ++pvars;
            } /* for */
          }   /* int pcou */

          {
            UNSIGNED qtemp;
            UNSIGNED next;
            UNSIGNED ntend;

            next = qtemp = (UNSIGNED)NativeAligned2FromStackOffset(frameex->nextblock);
            /* this is offset */
            ntend = 0; /* init flag */
            if (frameex->validnametable) {
              LispPTR nametable;
#ifdef BIGVM
              nametable = frameex->nametable;
#define hi2nametable (nametable >> 16)
#else
              unsigned int hi2nametable;
              unsigned int lonametable;
              lonametable = frameex->lonametable;
              hi2nametable = frameex->hi2nametable;
              nametable = VAG2(hi2nametable, lonametable);
#endif /* BIGVM */
              if (STK_HI == hi2nametable) {
                Stkref(fnheader->framename);
#ifdef BIGVM
                qtemp = (UNSIGNED)NativeAligned2FromStackOffset(nametable & 0xFFFF);
#else
                qtemp = (UNSIGNED)NativeAligned2FromStackOffset(lonametable);
#endif
                ntend = (UNSIGNED)(((DLword *)qtemp) + FNHEADSIZE +
                                   (((struct fnhead *)qtemp)->ntsize) * 2);
              } else
                Stkref(nametable);
            } /* frameex->validnametable */

            obasicframe = basicframe;
            basicframe =
                (Bframe *)ADD_OFFSET(basicframe, FRAMESIZE + PADDING + (((fnheader->pv) + 1) << 2));

            if (0 != (3 & (UNSIGNED)basicframe)) {
              char debugStr[100];
              sprintf(debugStr,
                      "Frame ptr (%p) not to word bound "
                      "in gcscanstack() STK_FX case; old frame = %p.",
                      (void *)basicframe, (void *)obasicframe);
              error(debugStr);
            }

          scantemps:
            while ((UNSIGNED)basicframe < (UNSIGNED)qtemp) {
              LispPTR value;
              value = *((LispPTR *)basicframe);
              if
                Boundp(BIND_BITS(value)) Stkref(value);
              basicframe++;
            } /* while */

            if (ntend != 0) {
              obasicframe = basicframe;
              basicframe = (Bframe *)ntend;
              if (0 != (3 & (UNSIGNED)basicframe)) {
                char debugStr[100];
                sprintf(debugStr,
                        "Frame ptr (%p) not to word bound "
                        "in gcscanstack() scantemps; old frame = %p.",
                        (void *)basicframe, (void *)obasicframe);
                error(debugStr);
              }

              qtemp = next;
              ntend = 0;
              goto scantemps;
            }

            obasicframe = basicframe;
            basicframe = (Bframe *)next;

            if (0 != (3 & (UNSIGNED)basicframe)) {
              char debugStr[100];
              sprintf(debugStr,
                      "Frame ptr (%p) not to word bound "
                      "in gcscanstack(), end scantemps; old frame = %p.",
                      (void *)basicframe, (void *)obasicframe);
              error(debugStr);
            }

          } /* LOCAL regs qtemp next */
        }   /* local regs fnheader frameex */
        break;
      }
      case STK_GUARD: /* stack's tail ? */ {
        if ((UNSIGNED)basicframe >= (UNSIGNED)scanend68K)
          return (NIL);
        else {
          obasicframe = basicframe;
          basicframe = (Bframe *)((DLword *)basicframe + basicframe->ivar);

          if (0 != (3 & (UNSIGNED)basicframe)) {
            char debugStr[100];
            sprintf(debugStr,
                    "Frame ptr (%p) not to word bound "
                    "in gcscanstack() STK_GUARD; old frame = %p.",
                    (void *)basicframe, (void *)obasicframe);
            error(debugStr);
          }
        }
        break;
      }
      case STK_FSB: {
        obasicframe = basicframe;
        basicframe = (Bframe *)((DLword *)basicframe + basicframe->ivar);

        if (0 != (3 & (UNSIGNED)basicframe)) {
          char debugStr[100];
          sprintf(debugStr,
                  "Frame ptr (%p) not to word bound "
                  "in gcscanstack() STK_FSB; old frame = %p.",
                  (void *)basicframe, (void *)obasicframe);
          error(debugStr);
        }

        break;
      }
      default: /* must be basic frame !! */
      {
        LispPTR bf_word;
        while (STK_BF != BF_FLAGS(bf_word = *((LispPTR *)basicframe))) {
          Stkref(PTR_BITS(bf_word));
          basicframe++;
        }
        basicframe++;
      }

        /* **** NOTE THIS CODE DOES NOT COMPILE CORRECTLY ON THE SUN 4
           {LispPTR bf_word;
           while(STK_BF != BF_FLAGS(
           bf_word = *((LispPTR *)basicframe++)))
           { Stkref(PTR_BITS(bf_word));
           }
           }
           **** */
    } /* switch */
  }   /* while(1) */
}